

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O2

roaring64_bitmap_t * roaring64_bitmap_or(roaring64_bitmap_t *r1,roaring64_bitmap_t *r2)

{
  art_val_t *paVar1;
  int iVar2;
  roaring64_bitmap_t *r;
  container_t *container;
  leaf_t lVar3;
  uint8_t result_typecode;
  art_iterator_t it2;
  art_iterator_t it1;
  
  r = roaring64_bitmap_create();
  art_init_iterator(&it1,&r1->art,true);
  art_init_iterator(&it2,&r2->art,true);
LAB_00106436:
  while( true ) {
    paVar1 = it2.value;
    if (it1.value == (art_val_t *)0x0 && it2.value == (art_val_t *)0x0) {
      return r;
    }
    if (it1.value != (art_val_t *)0x0 && it2.value != (art_val_t *)0x0) break;
    if (it1.value == (art_val_t *)0x0) goto LAB_0010653b;
    if (it2.value == (art_val_t *)0x0) {
LAB_00106498:
      lVar3 = copy_leaf_container(r1,r,*it1.value);
      art_insert(&r->art,it1.key,lVar3);
      art_iterator_next(&it1);
    }
  }
  iVar2 = art_compare_keys(it1.key,it2.key);
  if (iVar2 != 0) {
    if (paVar1 == (art_val_t *)0x0 || iVar2 < 0) goto LAB_00106498;
    goto LAB_00106544;
  }
  container = container_or(r1->containers[*it1.value >> 8],(uint8_t)*it1.value,
                           r2->containers[*it2.value >> 8],(uint8_t)*it2.value,&result_typecode);
  lVar3 = add_container(r,container,result_typecode);
  art_insert(&r->art,it1.key,lVar3);
  art_iterator_next(&it1);
  goto LAB_00106561;
LAB_0010653b:
  if (it2.value != (art_val_t *)0x0) {
LAB_00106544:
    lVar3 = copy_leaf_container(r2,r,*it2.value);
    art_insert(&r->art,it2.key,lVar3);
LAB_00106561:
    art_iterator_next(&it2);
  }
  goto LAB_00106436;
}

Assistant:

roaring64_bitmap_t *roaring64_bitmap_or(const roaring64_bitmap_t *r1,
                                        const roaring64_bitmap_t *r2) {
    roaring64_bitmap_t *result = roaring64_bitmap_create();

    art_iterator_t it1 = art_init_iterator((art_t *)&r1->art, /*first=*/true);
    art_iterator_t it2 = art_init_iterator((art_t *)&r2->art, /*first=*/true);

    while (it1.value != NULL || it2.value != NULL) {
        bool it1_present = it1.value != NULL;
        bool it2_present = it2.value != NULL;

        // Cases:
        // 1. it1_present  && !it2_present -> output it1, it1++
        // 2. !it1_present && it2_present  -> output it2, it2++
        // 3. it1_present  && it2_present
        //    a. it1 <  it2 -> output it1, it1++
        //    b. it1 == it2 -> output it1 | it2, it1++, it2++
        //    c. it1 >  it2 -> output it2, it2++
        int compare_result = 0;
        if (it1_present && it2_present) {
            compare_result = compare_high48(it1.key, it2.key);
            if (compare_result == 0) {
                // Case 3b: iterators at the same high key position.
                leaf_t leaf1 = (leaf_t)*it1.value;
                leaf_t leaf2 = (leaf_t)*it2.value;
                uint8_t result_typecode;
                container_t *result_container =
                    container_or(get_container(r1, leaf1), get_typecode(leaf1),
                                 get_container(r2, leaf2), get_typecode(leaf2),
                                 &result_typecode);
                leaf_t result_leaf =
                    add_container(result, result_container, result_typecode);
                art_insert(&result->art, it1.key, (art_val_t)result_leaf);
                art_iterator_next(&it1);
                art_iterator_next(&it2);
            }
        }
        if ((it1_present && !it2_present) || compare_result < 0) {
            // Cases 1 and 3a: it1 is the only iterator or is before it2.
            leaf_t result_leaf =
                copy_leaf_container(r1, result, (leaf_t)*it1.value);
            art_insert(&result->art, it1.key, (art_val_t)result_leaf);
            art_iterator_next(&it1);
        } else if ((!it1_present && it2_present) || compare_result > 0) {
            // Cases 2 and 3c: it2 is the only iterator or is before it1.
            leaf_t result_leaf =
                copy_leaf_container(r2, result, (leaf_t)*it2.value);
            art_insert(&result->art, it2.key, (art_val_t)result_leaf);
            art_iterator_next(&it2);
        }
    }
    return result;
}